

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.h
# Opt level: O2

void __thiscall
benchmark_data::benchmark_data
          (benchmark_data *this,char *i_name,int w,int h,char *f_name,int n_ipoints,long n_flops)

{
  this->width = w;
  this->height = h;
  this->num_interest_points = n_ipoints;
  this->num_flops = n_flops;
  this->avg_cycles = 0;
  this->min_cycles = 0;
  this->max_cycles = 0;
  this->flops_per_cycle = 0.0;
  strncpy(this->image_name,i_name,0x100);
  strncpy(this->function_name,f_name,0x100);
  return;
}

Assistant:

benchmark_data(char *i_name, int w, int h, char *f_name, int n_ipoints, long n_flops)
        : width(w),
          height(h),
          num_interest_points(n_ipoints),
          num_flops(n_flops),
          avg_cycles(0),
          min_cycles(0),
          max_cycles(0),
          flops_per_cycle(0.0) {
        // Copying image and function name strings into struct
        strncpy(image_name, i_name, 256);
        strncpy(function_name, f_name, 256);
    }